

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O1

void __thiscall Catch::Session::showHelp(Session *this,string *processName)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nCatch v",8);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," build ",7);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"master","");
  iVar2 = std::__cxx11::string::compare((char *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    pcVar1 = DAT_001643e8;
    if (DAT_001643e8 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x165298);
    }
    else {
      sVar4 = strlen(DAT_001643e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," branch)",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  Clara::CommandLine<Catch::ConfigData>::usage(&this->m_cli,(ostream *)&std::cout,processName);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"For more detail usage please see the project docs\n",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void showHelp( std::string const& processName ) {
            std::cout << "\nCatch v"    << libraryVersion.majorVersion << "."
                                        << libraryVersion.minorVersion << " build "
                                        << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                std::cout << " (" << libraryVersion.branchName << " branch)";
            std::cout << "\n";

            m_cli.usage( std::cout, processName );
            std::cout << "For more detail usage please see the project docs\n" << std::endl;
        }